

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cigar.h
# Opt level: O0

Cigar * __thiscall Cigar::operator+(Cigar *__return_storage_ptr__,Cigar *this,Cigar *other)

{
  bool bVar1;
  reference entry;
  CigarEntry *c;
  const_iterator __end1;
  const_iterator __begin1;
  Cigar *__range1;
  Cigar *other_local;
  Cigar *this_local;
  Cigar *ce;
  
  Cigar(__return_storage_ptr__,this);
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::begin
            ((const_iterator *)&__end1._M_node,
             &other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::end
            ((const_iterator *)&c,&other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&c), bVar1) {
    entry = std::_Deque_iterator<CigarEntry,_const_CigarEntry_&,_const_CigarEntry_*>::operator*
                      ((_Deque_iterator<CigarEntry,_const_CigarEntry_&,_const_CigarEntry_*> *)
                       &__end1._M_node);
    Add(__return_storage_ptr__,entry);
    std::_Deque_iterator<CigarEntry,_const_CigarEntry_&,_const_CigarEntry_*>::operator++
              ((_Deque_iterator<CigarEntry,_const_CigarEntry_&,_const_CigarEntry_*> *)
               &__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

Cigar operator+( const Cigar& other ) const {
    Cigar ce = *this;
    for( auto& c : other )
      ce.Add( c );
    return ce;
  }